

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.h
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1(TPZCompElH1<pzshape::TPZShapeQuad> *this)

{
  long local_20;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0178b670;
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeQuad>,&PTR_PTR_017867a8);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_017863d8;
  local_20 = -1;
  TPZManVector<long,_9>::TPZManVector(&this->fConnectIndexes,9,&local_20);
  this->fh1fam = EH1Standard;
  return;
}

Assistant:

TPZCompElH1() = default;